

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSerializeEngine.cpp
# Opt level: O0

XSerializeEngine * __thiscall
xercesc_4_0::XSerializeEngine::operator<<(XSerializeEngine *this,short sh)

{
  XMLSize_t bytesNeedToWrite;
  short sh_local;
  XSerializeEngine *this_local;
  
  bytesNeedToWrite = calBytesNeeded(this,2);
  checkAndFlushBuffer(this,bytesNeedToWrite);
  alignBufCur(this,2);
  *(short *)this->fBufCur = sh;
  this->fBufCur = this->fBufCur + 2;
  return this;
}

Assistant:

XSerializeEngine& XSerializeEngine::operator<<(short sh)
{
    checkAndFlushBuffer(calBytesNeeded(sizeof(short)));

    alignBufCur(sizeof(short));
    *reinterpret_cast<short*>(fBufCur) = sh;
    fBufCur += sizeof(short);
    return *this;
}